

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3RefillIndex(Parse *pParse,Index *pIndex,int memRootPage)

{
  ushort uVar1;
  int iCur;
  Table *pTab;
  Schema *pSVar2;
  int iVar3;
  int iVar4;
  int p2;
  Vdbe *p;
  KeyInfo *zP4;
  Parse *pPVar5;
  byte bVar6;
  Op *pOVar7;
  Schema **ppSVar8;
  int regOut;
  int iVar9;
  long in_FS_OFFSET;
  int local_70;
  Pgno local_6c;
  int iPartIdxLabel;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pTab = pIndex->pTable;
  iCur = pParse->nTab;
  pParse->nTab = iCur + 2;
  iPartIdxLabel = -0x55555556;
  if (pIndex->pSchema == (Schema *)0x0) {
    iVar9 = -0x8000;
  }
  else {
    iVar9 = -1;
    ppSVar8 = &pParse->db->aDb->pSchema;
    do {
      iVar9 = iVar9 + 1;
      pSVar2 = *ppSVar8;
      ppSVar8 = ppSVar8 + 4;
    } while (pSVar2 != pIndex->pSchema);
  }
  iVar3 = sqlite3AuthCheck(pParse,0x1b,pIndex->zName,(char *)0x0,pParse->db->aDb[iVar9].zDbSName);
  if (iVar3 == 0) {
    sqlite3TableLock(pParse,iVar9,pTab->tnum,'\x01',pTab->zName);
    p = sqlite3GetVdbe(pParse);
    if (p != (Vdbe *)0x0) {
      local_6c = memRootPage;
      if (memRootPage < 0) {
        local_6c = pIndex->tnum;
      }
      zP4 = sqlite3KeyInfoOfIndex(pParse,pIndex);
      iVar3 = pParse->nTab;
      pParse->nTab = iVar3 + 1;
      uVar1 = pIndex->nKeyCol;
      if (zP4 != (KeyInfo *)0x0) {
        zP4->nRef = zP4->nRef + 1;
      }
      iVar4 = sqlite3VdbeAddOp3(p,0x77,iVar3,0,(uint)uVar1);
      sqlite3VdbeChangeP4(p,iVar4,(char *)zP4,-8);
      sqlite3OpenTable(pParse,iCur,iVar9,pTab,0x66);
      iVar4 = sqlite3VdbeAddOp3(p,0x24,iCur,0,0);
      if (pParse->nTempReg == '\0') {
        regOut = pParse->nMem + 1;
        pParse->nMem = regOut;
      }
      else {
        bVar6 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar6;
        regOut = pParse->aTempReg[bVar6];
      }
      pPVar5 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar5 = pParse;
      }
      pPVar5->isMultiWrite = '\x01';
      sqlite3GenerateIndexKey(pParse,pIndex,iCur,regOut,0,&iPartIdxLabel,(Index *)0x0,0);
      sqlite3VdbeAddOp3(p,0x8b,iVar3,regOut,0);
      if (iPartIdxLabel != 0) {
        sqlite3VdbeResolveLabel(pParse->pVdbe,iPartIdxLabel);
      }
      sqlite3VdbeAddOp3(p,0x27,iCur,iVar4 + 1,0);
      if (p->db->mallocFailed == '\0') {
        pOVar7 = p->aOp + iVar4;
      }
      else {
        pOVar7 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      iVar4 = iCur + 1;
      pOVar7->p2 = p->nOp;
      if (memRootPage < 0) {
        sqlite3VdbeAddOp3(p,0x91,local_6c,iVar9,0);
      }
      iVar9 = sqlite3VdbeAddOp3(p,0x71,iVar4,local_6c,iVar9);
      sqlite3VdbeChangeP4(p,iVar9,(char *)zP4,-8);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = (ushort)(-1 < memRootPage) * 0x10 + 1;
      }
      iVar9 = sqlite3VdbeAddOp3(p,0x22,iVar3,0,0);
      if (pIndex->onError == '\0') {
        pPVar5 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar5 = pParse;
        }
        pPVar5->mayAbort = '\x01';
        local_70 = p->nOp;
      }
      else {
        p2 = sqlite3VdbeAddOp3(p,9,0,1,0);
        local_70 = p->nOp;
        sqlite3VdbeAddOp4Int(p,0x84,iVar3,p2,regOut,(uint)pIndex->nKeyCol);
        sqlite3UniqueConstraint(pParse,2,pIndex);
        if (p->db->mallocFailed == '\0') {
          pOVar7 = p->aOp + p2;
        }
        else {
          pOVar7 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar7->p2 = p->nOp;
      }
      sqlite3VdbeAddOp3(p,0x85,iVar3,regOut,iVar4);
      if ((pIndex->field_0x64 & 4) == 0) {
        sqlite3VdbeAddOp3(p,0x89,iVar4,0,0);
      }
      sqlite3VdbeAddOp3(p,0x8a,iVar4,regOut,0);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = 0x10;
      }
      if (regOut != 0) {
        bVar6 = pParse->nTempReg;
        if ((ulong)bVar6 < 8) {
          pParse->nTempReg = bVar6 + 1;
          pParse->aTempReg[bVar6] = regOut;
        }
      }
      sqlite3VdbeAddOp3(p,0x25,iVar3,local_70,0);
      if (p->db->mallocFailed == '\0') {
        pOVar7 = p->aOp + iVar9;
      }
      else {
        pOVar7 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar7->p2 = p->nOp;
      sqlite3VdbeAddOp3(p,0x7a,iCur,0,0);
      sqlite3VdbeAddOp3(p,0x7a,iVar4,0,0);
      sqlite3VdbeAddOp3(p,0x7a,iVar3,0,0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void sqlite3RefillIndex(Parse *pParse, Index *pIndex, int memRootPage){
  Table *pTab = pIndex->pTable;  /* The table that is indexed */
  int iTab = pParse->nTab++;     /* Btree cursor used for pTab */
  int iIdx = pParse->nTab++;     /* Btree cursor used for pIndex */
  int iSorter;                   /* Cursor opened by OpenSorter (if in use) */
  int addr1;                     /* Address of top of loop */
  int addr2;                     /* Address to jump to for next iteration */
  Pgno tnum;                     /* Root page of index */
  int iPartIdxLabel;             /* Jump to this label to skip a row */
  Vdbe *v;                       /* Generate code into this virtual machine */
  KeyInfo *pKey;                 /* KeyInfo for index */
  int regRecord;                 /* Register holding assembled index record */
  sqlite3 *db = pParse->db;      /* The database connection */
  int iDb = sqlite3SchemaToIndex(db, pIndex->pSchema);

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_REINDEX, pIndex->zName, 0,
      db->aDb[iDb].zDbSName ) ){
    return;
  }
#endif

  /* Require a write-lock on the table to perform this operation */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);

  v = sqlite3GetVdbe(pParse);
  if( v==0 ) return;
  if( memRootPage>=0 ){
    tnum = (Pgno)memRootPage;
  }else{
    tnum = pIndex->tnum;
  }
  pKey = sqlite3KeyInfoOfIndex(pParse, pIndex);
  assert( pKey!=0 || pParse->nErr );

  /* Open the sorter cursor if we are to use one. */
  iSorter = pParse->nTab++;
  sqlite3VdbeAddOp4(v, OP_SorterOpen, iSorter, 0, pIndex->nKeyCol, (char*)
                    sqlite3KeyInfoRef(pKey), P4_KEYINFO);

  /* Open the table. Loop through all rows of the table, inserting index
  ** records into the sorter. */
  sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
  addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, 0); VdbeCoverage(v);
  regRecord = sqlite3GetTempReg(pParse);
  sqlite3MultiWrite(pParse);

  sqlite3GenerateIndexKey(pParse,pIndex,iTab,regRecord,0,&iPartIdxLabel,0,0);
  sqlite3VdbeAddOp2(v, OP_SorterInsert, iSorter, regRecord);
  sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
  sqlite3VdbeAddOp2(v, OP_Next, iTab, addr1+1); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);
  if( memRootPage<0 ) sqlite3VdbeAddOp2(v, OP_Clear, tnum, iDb);
  sqlite3VdbeAddOp4(v, OP_OpenWrite, iIdx, (int)tnum, iDb,
                    (char *)pKey, P4_KEYINFO);
  sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR|((memRootPage>=0)?OPFLAG_P2ISREG:0));

  addr1 = sqlite3VdbeAddOp2(v, OP_SorterSort, iSorter, 0); VdbeCoverage(v);
  if( IsUniqueIndex(pIndex) ){
    int j2 = sqlite3VdbeGoto(v, 1);
    addr2 = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeVerifyAbortable(v, OE_Abort);
    sqlite3VdbeAddOp4Int(v, OP_SorterCompare, iSorter, j2, regRecord,
                         pIndex->nKeyCol); VdbeCoverage(v);
    sqlite3UniqueConstraint(pParse, OE_Abort, pIndex);
    sqlite3VdbeJumpHere(v, j2);
  }else{
    /* Most CREATE INDEX and REINDEX statements that are not UNIQUE can not
    ** abort. The exception is if one of the indexed expressions contains a
    ** user function that throws an exception when it is evaluated. But the
    ** overhead of adding a statement journal to a CREATE INDEX statement is
    ** very small (since most of the pages written do not contain content that
    ** needs to be restored if the statement aborts), so we call
    ** sqlite3MayAbort() for all CREATE INDEX statements.  */
    sqlite3MayAbort(pParse);
    addr2 = sqlite3VdbeCurrentAddr(v);
  }
  sqlite3VdbeAddOp3(v, OP_SorterData, iSorter, regRecord, iIdx);
  if( !pIndex->bAscKeyBug ){
    /* This OP_SeekEnd opcode makes index insert for a REINDEX go much
    ** faster by avoiding unnecessary seeks.  But the optimization does
    ** not work for UNIQUE constraint indexes on WITHOUT ROWID tables
    ** with DESC primary keys, since those indexes have there keys in
    ** a different order from the main table.
    ** See ticket: https://www.sqlite.org/src/info/bba7b69f9849b5bf
    */
    sqlite3VdbeAddOp1(v, OP_SeekEnd, iIdx);
  }
  sqlite3VdbeAddOp2(v, OP_IdxInsert, iIdx, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  sqlite3ReleaseTempReg(pParse, regRecord);
  sqlite3VdbeAddOp2(v, OP_SorterNext, iSorter, addr2); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);

  sqlite3VdbeAddOp1(v, OP_Close, iTab);
  sqlite3VdbeAddOp1(v, OP_Close, iIdx);
  sqlite3VdbeAddOp1(v, OP_Close, iSorter);
}